

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::ParameterSymbol::getValue(ParameterSymbol *this,SourceRange referencingRange)

{
  bool bVar1;
  Compilation *pCVar2;
  Scope *pSVar3;
  DeclaredType *pDVar4;
  bool bVar5;
  Type *this_00;
  ConstantValue *pCVar6;
  Diagnostic *pDVar7;
  Expression *expr;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_50;
  
  if (this->value == (ConstantValue *)0x0) {
    pSVar3 = (this->super_ValueSymbol).super_Symbol.parentScope;
    local_88._8_4_ = 0xffffffff;
    local_88._16_8_ = 0;
    local_88._24_8_ = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    if (this->isFromConf == true) {
      local_88._16_8_ = 0x10000000000;
    }
    bVar1 = this->evaluating;
    local_88._0_8_ = pSVar3;
    if (bVar1 == true) {
      pDVar7 = ASTContext::addDiag((ASTContext *)&local_88,(DiagCode)0x17000c,
                                   (this->super_ValueSymbol).super_Symbol.location);
      pDVar7 = Diagnostic::operator<<(pDVar7,(this->super_ValueSymbol).super_Symbol.name);
      Diagnostic::addNote(pDVar7,(DiagCode)0xd0001,referencingRange);
    }
    else {
      this->evaluating = true;
      expr = DeclaredType::getInitializer(&(this->super_ValueSymbol).declaredType);
      if (expr == (Expression *)0x0) {
        this->value = (ConstantValue *)ConstantValue::Invalid;
      }
      else {
        pCVar2 = pSVar3->compilation;
        ASTContext::eval((ConstantValue *)&local_50,(ASTContext *)&local_88,expr,
                         (bitmask<slang::ast::EvalFlags>)0x10);
        pCVar6 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                           (&pCVar2->constantAllocator,(ConstantValue *)&local_50);
        this->value = pCVar6;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_50);
        pDVar4 = (this->super_ValueSymbol).declaredType.typeOrLink.link;
        if ((((pDVar4 != (DeclaredType *)0x0 &&
               -1 < *(int *)&(this->super_ValueSymbol).declaredType.field_0x3c) &&
             (*(int *)&pDVar4->parent == 0xf7)) && (pDVar4->initializer == (Expression *)0x0)) &&
           (pDVar4[1].dimensions == (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0)) {
          bVar5 = Expression::isImplicitString(expr);
          this->fromStringLit = bVar5;
        }
      }
      this->evaluating = false;
    }
    if (bVar1 != false) {
      return (ConstantValue *)ConstantValue::Invalid;
    }
  }
  else if (this->needsCoercion == true) {
    pCVar2 = ((this->super_ValueSymbol).super_Symbol.parentScope)->compilation;
    this_00 = DeclaredType::getType(&(this->super_ValueSymbol).declaredType);
    Type::coerceValue((ConstantValue *)&local_88,this_00,this->value);
    pCVar6 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                       (&pCVar2->constantAllocator,(ConstantValue *)&local_88);
    this->value = pCVar6;
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_88);
    this->needsCoercion = false;
  }
  return this->value;
}

Assistant:

const ConstantValue& ParameterSymbol::getValue(SourceRange referencingRange) const {
    if (!value) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        ASTContext ctx(*scope, LookupLocation::max);
        if (isFromConf)
            ctx.flags |= ASTFlags::ConfigParam;

        if (evaluating) {
            SLANG_ASSERT(referencingRange.start());

            auto& diag = ctx.addDiag(diag::ConstEvalParamCycle, location) << name;
            diag.addNote(diag::NoteReferencedHere, referencingRange);
            return ConstantValue::Invalid;
        }

        evaluating = true;
        auto guard = ScopeGuard([this] { evaluating = false; });

        // If no value has been explicitly set, try to set it
        // from our initializer.
        auto init = getInitializer();
        if (init) {
            value = scope->getCompilation().allocConstant(
                ctx.eval(*init, EvalFlags::AllowUnboundedPlaceholder));

            // If this parameter has an implicit type declared and it was assigned
            // a string literal, make a note so that this parameter gets treated
            // as an implicit string itself in further expressions.
            auto typeSyntax = getDeclaredType()->getTypeSyntax();
            if (typeSyntax && typeSyntax->kind == SyntaxKind::ImplicitType) {
                auto& its = typeSyntax->as<ImplicitTypeSyntax>();
                if (!its.signing && its.dimensions.empty())
                    fromStringLit = init->isImplicitString();
            }
        }
        else {
            value = &ConstantValue::Invalid;
        }
    }
    else if (needsCoercion) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        value = scope->getCompilation().allocConstant(getType().coerceValue(*value));
        needsCoercion = false;
    }

    return *value;
}